

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O1

int Cut_CellTableLookup(Cut_CMan_t *p,Cut_Cell_t *pCell)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  char **in_RAX;
  ulong uVar4;
  int iVar5;
  long *plVar6;
  ulong uVar7;
  Cut_Cell_t **pSlot;
  char **local_18;
  
  uVar3 = *(uint *)&pCell->field_0x20 & 0xf;
  iVar5 = 1 << ((char)uVar3 - 5U & 0x1f);
  if (uVar3 < 6) {
    iVar5 = 1;
  }
  local_18 = in_RAX;
  uVar3 = Extra_TruthHash(pCell->uTruth,iVar5);
  iVar5 = st__find_or_add(p->tTable,(char *)(ulong)uVar3,&local_18);
  if (iVar5 == 0) {
    *local_18 = (char *)0x0;
  }
  plVar6 = (long *)*local_18;
  if (plVar6 != (long *)0x0) {
    uVar3 = *(uint *)&pCell->field_0x20 & 0xf;
    uVar7 = (ulong)(uint)(1 << ((char)uVar3 - 5U & 0x1f));
    if (uVar3 < 6) {
      uVar7 = 1;
    }
    do {
      uVar4 = uVar7;
      if ((*(uint *)(plVar6 + 4) & 0xf) == uVar3) {
        do {
          iVar5 = (int)uVar4;
          if (iVar5 < 1) {
            return 1;
          }
          lVar1 = uVar4 * 4;
          lVar2 = uVar4 - 1;
          uVar4 = uVar4 - 1;
        } while (*(uint *)((long)plVar6 + lVar1 + 0x50) == pCell->uTruth[lVar2]);
        if (iVar5 < 1) {
          return 1;
        }
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
  pCell->pNext = (Cut_Cell_t *)*local_18;
  *local_18 = (char *)pCell;
  uVar3 = *(uint *)&pCell->field_0x20 & 0xf;
  pCell->pNextVar = p->pSameVar[uVar3];
  p->pSameVar[uVar3] = pCell;
  return 0;
}

Assistant:

int Cut_CellTableLookup( Cut_CMan_t * p, Cut_Cell_t * pCell )
{
    Cut_Cell_t ** pSlot, * pTemp;
    unsigned Hash;
    Hash = Extra_TruthHash( pCell->uTruth, Extra_TruthWordNum( pCell->nVars ) );
    if ( ! st__find_or_add( p->tTable, (char *)(ABC_PTRUINT_T)Hash, (char ***)&pSlot ) )
        *pSlot = NULL;
    for ( pTemp = *pSlot; pTemp; pTemp = pTemp->pNext )
    {
        if ( pTemp->nVars != pCell->nVars )
            continue;
        if ( Extra_TruthIsEqual(pTemp->uTruth, pCell->uTruth, pCell->nVars) )
            return 1;
    }
    // the entry is new
    pCell->pNext = *pSlot;
    *pSlot = pCell;
    // add it to the variable support list
    pCell->pNextVar = p->pSameVar[pCell->nVars];
    p->pSameVar[pCell->nVars] = pCell;
    return 0;
}